

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flood.cpp
# Opt level: O3

void __thiscall
vera::Flood::allocate
          (Flood *this,int _width,int _height,FboType _type,TextureFilter _filter,TextureWrap _wrap,
          bool _autoclear)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  
  iVar1 = _height;
  if (_height < _width) {
    iVar1 = _width;
  }
  dVar3 = log2((double)iVar1);
  dVar3 = ceil(dVar3);
  uVar2 = (ulong)(dVar3 + 1.0);
  this->m_interations = (long)((dVar3 + 1.0) - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
  (**(code **)(*(long *)&(this->super_PingPong).field_0x18 + 0x10))
            (&(this->super_PingPong).field_0x18,_width,_height,_type,_filter,_wrap,_autoclear);
  (**(code **)(*(long *)&(this->super_PingPong).field_0x50 + 0x10))
            (&(this->super_PingPong).field_0x50,_width,_height,_type,_filter,_wrap,_autoclear);
  (*(this->super_PingPong)._vptr_PingPong[4])(0,this);
  (this->super_PingPong).m_flag = 0;
  (*(this->super_PingPong)._vptr_PingPong[3])(this);
  return;
}

Assistant:

void Flood::allocate(int _width, int _height, FboType _type, TextureFilter _filter, TextureWrap _wrap, bool _autoclear) {
    // Set number of iterations based on the resolution
    m_interations = ceil(log2(std::max(_width, _height)) / log2(2.0)) + 1;

    // Allocate the FBOs
    for(int i = 0; i < 2; i++)
        m_fbos[i].allocate(_width, _height, _type, _filter, _wrap, _autoclear);

    // Clean the FBOs
    clear();

    // Set everything to 0
    m_flag = 0;
    swap();
}